

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O2

Float pbrt::HenyeyGreenstein(Float cosTheta,Float g)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar5 [64];
  
  auVar5._4_60_ = in_register_00001244;
  auVar5._0_4_ = g;
  auVar3._4_60_ = in_register_00001204;
  auVar3._0_4_ = cosTheta;
  auVar4 = auVar5._0_16_;
  auVar1 = vfmadd213ss_fma(auVar4,auVar4,SUB6416(ZEXT464(0x3f800000),0));
  auVar2 = vfnmadd213ss_fma(auVar4,auVar4,SUB6416(ZEXT464(0x3f800000),0));
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)(g + g)),auVar3._0_16_,auVar1);
  auVar1 = vmaxss_avx(auVar4,ZEXT816(0) << 0x20);
  auVar1 = vsqrtss_avx(auVar1,auVar1);
  return (auVar2._0_4_ * 0.07957747) / (auVar4._0_4_ * auVar1._0_4_);
}

Assistant:

PBRT_CPU_GPU
inline Float HenyeyGreenstein(Float cosTheta, Float g) {
    Float denom = 1 + g * g + 2 * g * cosTheta;
    return Inv4Pi * (1 - g * g) / (denom * SafeSqrt(denom));
}